

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O1

void __thiscall Display::calculateStates(Display *this)

{
  long lVar1;
  uint __val;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  char cVar8;
  uint __len;
  int x;
  long lVar9;
  int y;
  int y_00;
  long lVar10;
  Minefield mfield;
  char *local_b8 [2];
  char local_a8 [16];
  Minefield local_98;
  
  Controller::getMinefield(&local_98,&this->controller);
  lVar9 = 0;
  do {
    iVar4 = Minefield::getXDimension(&local_98);
    if (iVar4 <= lVar9) {
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&local_98.opened);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&local_98.flags);
      std::
      vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ::~vector(&local_98.mines);
      return;
    }
    lVar10 = 0;
    while( true ) {
      iVar4 = Minefield::getYDimension(&local_98);
      if (iVar4 <= lVar10) break;
      iVar4 = (int)lVar9;
      y_00 = (int)lVar10;
      bVar3 = Minefield::isOpen(&local_98,iVar4,y_00);
      if (bVar3) {
        uVar5 = Minefield::getSorroundingMineCount(&local_98,iVar4,y_00);
        __val = -uVar5;
        if (0 < (int)uVar5) {
          __val = uVar5;
        }
        __len = 1;
        if (9 < __val) {
          uVar7 = (ulong)__val;
          uVar2 = 4;
          do {
            __len = uVar2;
            uVar6 = (uint)uVar7;
            if (uVar6 < 100) {
              __len = __len - 2;
              goto LAB_00109e0b;
            }
            if (uVar6 < 1000) {
              __len = __len - 1;
              goto LAB_00109e0b;
            }
            if (uVar6 < 10000) goto LAB_00109e0b;
            uVar7 = uVar7 / 10000;
            uVar2 = __len + 4;
          } while (99999 < uVar6);
          __len = __len + 1;
        }
LAB_00109e0b:
        local_b8[0] = local_a8;
        std::__cxx11::string::_M_construct((ulong)local_b8,(char)__len - (char)((int)uVar5 >> 0x1f))
        ;
        std::__detail::__to_chars_10_impl<unsigned_int>(local_b8[0] + (uVar5 >> 0x1f),__len,__val);
        cVar8 = *local_b8[0];
        if (local_b8[0] != local_a8) {
          operator_delete(local_b8[0]);
        }
        bVar3 = Minefield::isMine(&local_98,iVar4,y_00);
        if (cVar8 == '0') {
          cVar8 = ' ';
        }
        if (bVar3) {
          cVar8 = 'X';
          uVar5 = 0xb;
        }
      }
      else {
        bVar3 = Minefield::isGameLost(&local_98);
        if (((!bVar3) || (bVar3 = Minefield::isMine(&local_98,iVar4,y_00), !bVar3)) ||
           (bVar3 = Minefield::isFlagged(&local_98,iVar4,y_00), bVar3)) {
          bVar3 = Minefield::isFlagged(&local_98,iVar4,y_00);
          if (bVar3) {
            bVar3 = Minefield::isGameEnded(&local_98);
            cVar8 = '?';
            uVar5 = 0;
            if (bVar3) {
              bVar3 = Minefield::isMine(&local_98,iVar4,y_00);
              uVar5 = 0xb;
              if (bVar3) {
                uVar5 = 0;
              }
            }
          }
          else {
            cVar8 = '*';
            uVar5 = 10;
          }
        }
        else {
          cVar8 = 'X';
          uVar5 = 0xb;
        }
      }
      lVar1 = *(long *)&(this->state).
                        super__Vector_base<std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>,_std::allocator<std::vector<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar9].
                        super__Vector_base<std::tuple<int,_char>,_std::allocator<std::tuple<int,_char>_>_>
                        ._M_impl.super__Vector_impl_data;
      if ((*(uint *)(lVar1 + 4 + lVar10 * 8) != uVar5) || (*(char *)(lVar1 + lVar10 * 8) != cVar8))
      {
        *(uint *)(lVar1 + 4 + lVar10 * 8) = uVar5;
        *(char *)(lVar1 + lVar10 * 8) = cVar8;
      }
      lVar10 = lVar10 + 1;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void Display::calculateStates() {
    auto mfield = controller.getMinefield();
    
    for (int x = 0; x < mfield.getXDimension(); x++) {
        for (int y = 0; y < mfield.getYDimension(); y++) {
            char to_print;
            int color;
            if (mfield.isOpen(x, y)) {
                auto sourrounding_mine_count = mfield.getSorroundingMineCount(x, y);
                color = sourrounding_mine_count;
                to_print = std::to_string(sourrounding_mine_count).c_str()[0];
                if ('0' == to_print) {
                    to_print = ' ';
                }

                if (mfield.isMine(x, y)) {
                    color = 11;
                    to_print = 'X';
                }
            } else if (mfield.isGameLost() && mfield.isMine(x, y) && !mfield.isFlagged(x, y)) {
                // mark only unflagged mines
                color = 11;
                to_print = 'X';
            } else if (mfield.isFlagged(x, y)) {
                color = 0;
                to_print = '?';
                if (mfield.isGameEnded() && !mfield.isMine(x, y)) {
                    // incorrect mine -> make red
                    color = 11;
                }
            } else {
                color = 10;
                to_print = '*';
            }

            auto tuple_to_print = std::make_tuple(color, to_print);
            if (state[x][y] != tuple_to_print) {
                state[x][y] = tuple_to_print;
            }
        }
    }
}